

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O0

int __thiscall
TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>::Subst_Forward
          (TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_> *this,
          TPZFMatrix<double> *b)

{
  long in_RDI;
  DecomposeType dec;
  DecomposeType in_stack_00003354;
  TPZFMatrix<double> *in_stack_00003358;
  TPZFileEqnStorage<double> *in_stack_00003360;
  
  std::operator<<((ostream *)&std::cout,"Entering Forward Substitution\n");
  std::ostream::flush();
  TPZFrontSym<double>::GetDecomposeType((TPZFrontSym<double> *)(in_RDI + 0xd8));
  TPZFileEqnStorage<double>::Forward(in_stack_00003360,in_stack_00003358,in_stack_00003354);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Forward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Forward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Forward(*b, dec);
	return 1;
}